

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

float ImGuizmo::ComputeAngleOnPlan(void)

{
  float fVar1;
  float fVar2;
  vec_t vVar3;
  float angle;
  float acosAngle;
  undefined1 local_5c [8];
  vec_t perpendicularVector;
  vec_t local_3c;
  vec_t local_2c;
  undefined1 local_1c [8];
  vec_t localPos;
  float len;
  
  localPos.z = IntersectRayPlane((vec_t *)&DAT_0029703c,(vec_t *)&DAT_0029704c,
                                 (vec_t *)&DAT_0029708c);
  vVar3 = vec_t::operator*((vec_t *)&DAT_0029704c,localPos.z);
  perpendicularVector._8_8_ = vVar3._0_8_;
  vVar3 = vec_t::operator+((vec_t *)&DAT_0029703c,(vec_t *)&perpendicularVector.z);
  local_3c._0_8_ = vVar3._0_8_;
  local_3c._8_8_ = vVar3._8_8_;
  vVar3 = vec_t::operator-(&local_3c,(vec_t *)&DAT_00296e9c);
  local_2c._0_8_ = vVar3._0_8_;
  local_2c._8_8_ = vVar3._8_8_;
  vVar3 = Normalized(&local_2c);
  local_1c = vVar3._0_8_;
  localPos._0_8_ = vVar3._8_8_;
  vec_t::Cross((vec_t *)local_5c,(vec_t *)&DAT_002970bc,(vec_t *)&DAT_0029708c);
  vec_t::Normalize((vec_t *)local_5c);
  fVar1 = Dot((vec_t *)local_1c,(vec_t *)&DAT_002970bc);
  fVar1 = Clamp<float>(fVar1,-0.9999,0.9999);
  fVar1 = acosf(fVar1);
  fVar2 = Dot((vec_t *)local_1c,(vec_t *)local_5c);
  return (float)(~-(uint)(fVar2 < 0.0) & 0xbf800000 | -(uint)(fVar2 < 0.0) & 0x3f800000) * fVar1;
}

Assistant:

static float ComputeAngleOnPlan()
   {
      const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, gContext.mTranslationPlan);
      vec_t localPos = Normalized(gContext.mRayOrigin + gContext.mRayVector * len - gContext.mModel.v.position);

      vec_t perpendicularVector;
      perpendicularVector.Cross(gContext.mRotationVectorSource, gContext.mTranslationPlan);
      perpendicularVector.Normalize();
      float acosAngle = Clamp(Dot(localPos, gContext.mRotationVectorSource), -0.9999f, 0.9999f);
      float angle = acosf(acosAngle);
      angle *= (Dot(localPos, perpendicularVector) < 0.f) ? 1.f : -1.f;
      return angle;
   }